

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cc
# Opt level: O0

void __thiscall re2c::Scanner::fill(Scanner *this,uint32_t need)

{
  char *pcVar1;
  opt_t *poVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  size_t have;
  char *buf;
  size_t copy;
  size_t move;
  ptrdiff_t diff;
  uint32_t need_local;
  Scanner *this_local;
  
  if ((this->super_ScannerState).eof == (char *)0x0) {
    poVar2 = Opt::operator->((Opt *)&opts);
    if (((poVar2->rFlag & 1U) == 0) &&
       (lVar3 = (long)(this->super_ScannerState).tok - (long)(this->super_ScannerState).bot,
       0 < lVar3)) {
      memmove((this->super_ScannerState).bot,(this->super_ScannerState).tok,
              (long)(this->super_ScannerState).top - (long)(this->super_ScannerState).tok);
      (this->super_ScannerState).tok = (this->super_ScannerState).tok + -lVar3;
      (this->super_ScannerState).ptr = (this->super_ScannerState).ptr + -lVar3;
      (this->super_ScannerState).cur = (this->super_ScannerState).cur + -lVar3;
      (this->super_ScannerState).pos = (this->super_ScannerState).pos + -lVar3;
      (this->super_ScannerState).lim = (this->super_ScannerState).lim + -lVar3;
      (this->super_ScannerState).ctx = (this->super_ScannerState).ctx + -lVar3;
    }
    diff._4_4_ = need;
    if (need < 0x2000) {
      diff._4_4_ = 0x2000;
    }
    if ((uint)((int)(this->super_ScannerState).top - (int)(this->super_ScannerState).lim) <
        diff._4_4_) {
      sVar4 = (long)(this->super_ScannerState).lim - (long)(this->super_ScannerState).bot;
      pcVar5 = (char *)operator_new__(sVar4 + diff._4_4_);
      if (pcVar5 == (char *)0x0) {
        fatal(this,"Out of memory");
      }
      memcpy(pcVar5,(this->super_ScannerState).bot,sVar4);
      (this->super_ScannerState).tok =
           pcVar5 + ((long)(this->super_ScannerState).tok - (long)(this->super_ScannerState).bot);
      (this->super_ScannerState).ptr =
           pcVar5 + ((long)(this->super_ScannerState).ptr - (long)(this->super_ScannerState).bot);
      (this->super_ScannerState).cur =
           pcVar5 + ((long)(this->super_ScannerState).cur - (long)(this->super_ScannerState).bot);
      (this->super_ScannerState).pos =
           pcVar5 + ((long)(this->super_ScannerState).pos - (long)(this->super_ScannerState).bot);
      (this->super_ScannerState).lim =
           pcVar5 + ((long)(this->super_ScannerState).lim - (long)(this->super_ScannerState).bot);
      (this->super_ScannerState).top = (this->super_ScannerState).lim + diff._4_4_;
      (this->super_ScannerState).ctx =
           pcVar5 + ((long)(this->super_ScannerState).ctx - (long)(this->super_ScannerState).bot);
      pcVar1 = (this->super_ScannerState).bot;
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
      }
      (this->super_ScannerState).bot = pcVar5;
    }
    sVar4 = fread((this->super_ScannerState).lim,1,(ulong)diff._4_4_,(FILE *)this->in->file);
    if (sVar4 != diff._4_4_) {
      (this->super_ScannerState).eof = (this->super_ScannerState).lim + sVar4;
      pcVar5 = (this->super_ScannerState).eof;
      (this->super_ScannerState).eof = pcVar5 + 1;
      *pcVar5 = '\0';
    }
    (this->super_ScannerState).lim = (this->super_ScannerState).lim + sVar4;
  }
  return;
}

Assistant:

void Scanner::fill (uint32_t need)
{
	if(!eof)
	{
		/* Do not get rid of anything when rFlag is active. Otherwise
		 * get rid of everything that was already handedout. */
		if (!opts->rFlag)
		{
			const ptrdiff_t diff = tok - bot;
			if (diff > 0)
			{
				const size_t move = static_cast<size_t> (top - tok);
				memmove (bot, tok, move);
				tok -= diff;
				ptr -= diff;
				cur -= diff;
				pos -= diff;
				lim -= diff;
				ctx -= diff;
			}
		}
		/* In crease buffer size. */
		if (BSIZE > need)
		{
			need = BSIZE;
		}
		if (static_cast<uint32_t> (top - lim) < need)
		{
			const size_t copy = static_cast<size_t> (lim - bot);
			char * buf = new char[copy + need];
			if (!buf)
			{
				fatal("Out of memory");
			}
			memcpy (buf, bot, copy);
			tok = &buf[tok - bot];
			ptr = &buf[ptr - bot];
			cur = &buf[cur - bot];
			pos = &buf[pos - bot];
			lim = &buf[lim - bot];
			top = &lim[need];
			ctx = &buf[ctx - bot];
			delete [] bot;
			bot = buf;
		}
		/* Append to buffer. */
		const size_t have = fread (lim, 1, need, in.file);
		if (have != need)
		{
			eof = &lim[have];
			*eof++ = '\0';
		}
		lim += have;
	}
}